

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

bool ON_XMLNodePrivate::RecoverProperty(ON_wString *tag,int equalSign,ON_wString *sProp)

{
  wchar_t wVar1;
  int iVar2;
  int iVar3;
  wchar_t *tag_name;
  bool bVar4;
  ON_wString local_88;
  ON_wString local_80;
  ON_wString local_78;
  ON_wString local_70;
  ON_wString sValue;
  int secondQuote;
  int start;
  ON_wString local_50 [3];
  int local_34;
  int leftScan;
  ON_wString sName;
  ON_wString *sProp_local;
  int equalSign_local;
  ON_wString *tag_local;
  
  sName.m_s = (wchar_t *)sProp;
  wVar1 = ON_wString::operator[](tag,equalSign);
  ON_REMOVE_ASAP_AssertEx
            ((uint)(wVar1 == L'='),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
             ,0x956,"","tag[equalSign] == L\'=\' is false");
  ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffffd0);
  local_34 = equalSign + -1;
  while( true ) {
    bVar4 = false;
    if (0 < local_34) {
      wVar1 = ON_wString::operator[](tag,local_34);
      bVar4 = wVar1 != L' ';
    }
    iVar2 = local_34;
    if (!bVar4) break;
    local_34 = local_34 + -1;
    wVar1 = ON_wString::operator[](tag,iVar2);
    ON_wString::ON_wString((ON_wString *)&start,wVar1,1);
    ON_wString::operator+(local_50,(ON_wString *)&start);
    ON_wString::operator=((ON_wString *)&stack0xffffffffffffffd0,local_50);
    ON_wString::~ON_wString(local_50);
    ON_wString::~ON_wString((ON_wString *)&start);
  }
  tag_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffffd0);
  bVar4 = IsValidXMLNameWithDebugging(tag_name);
  if ((!bVar4) || (bVar4 = ON_wString::IsEmpty((ON_wString *)&stack0xffffffffffffffd0), bVar4)) {
    tag_local._7_1_ = false;
  }
  else {
    iVar2 = equalSign + 2;
    iVar3 = ON_wString::Length(tag);
    if (iVar2 < iVar3) {
      wVar1 = ON_wString::operator[](tag,equalSign + 1);
      if (wVar1 == L'\"') {
        sValue.m_s._4_4_ = ON_wString::Find(tag,L'\"',iVar2);
        if (sValue.m_s._4_4_ == -1) {
          tag_local._7_1_ = false;
        }
        else {
          ON_wString::Mid(&local_70,(int)tag,iVar2);
          EncodeXML(&local_70);
          ON_wString::operator+(&local_88,(wchar_t *)&stack0xffffffffffffffd0);
          ON_wString::operator+(&local_80,&local_88);
          ON_wString::operator+(&local_78,(wchar_t *)&local_80);
          ON_wString::operator=((ON_wString *)sName.m_s,&local_78);
          ON_wString::~ON_wString(&local_78);
          ON_wString::~ON_wString(&local_80);
          ON_wString::~ON_wString(&local_88);
          tag_local._7_1_ = true;
          ON_wString::~ON_wString(&local_70);
        }
      }
      else {
        tag_local._7_1_ = false;
      }
    }
    else {
      tag_local._7_1_ = false;
    }
  }
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd0);
  return tag_local._7_1_;
}

Assistant:

bool ON_XMLNodePrivate::RecoverProperty(const ON_wString& tag, int equalSign, ON_wString& sProp) // Static.
{
  // Move left, looking for a space and ensuring every character is a valid name char.
  ON_ASSERT(tag[equalSign] == L'=');

  ON_wString sName;
  int leftScan = equalSign - 1;
  while (leftScan > 0 && tag[leftScan] != L' ')
  {
    sName = ON_wString(tag[leftScan--]) + sName;
  }

  if (!IsValidXMLNameWithDebugging(sName) || sName.IsEmpty())
    return false;

  // Now try to recover the value.
  const int start = equalSign + 2;
  if (start >= tag.Length())
    return false;

  if (tag[equalSign + 1] != L'\"')
    return false;

  const int secondQuote = tag.Find(L'\"', start);
  if (secondQuote == -1)
    return false;

  ON_wString sValue = tag.Mid(start, secondQuote - start);
  EncodeXML(sValue);

  sProp = sName + L"=\"" + sValue + L"\"";

  return true;
}